

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.cc
# Opt level: O3

void __thiscall
tchecker::system::system_builder_t::visit(system_builder_t *this,system_declaration_t *d)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  __normal_iterator<const_std::shared_ptr<tchecker::parsing::inner_declaration_t>_*,_std::vector<std::shared_ptr<tchecker::parsing::inner_declaration_t>,_std::allocator<std::shared_ptr<tchecker::parsing::inner_declaration_t>_>_>_>
  _Var2;
  range_t<__gnu_cxx::__normal_iterator<const_std::shared_ptr<tchecker::parsing::inner_declaration_t>_*,_std::vector<std::shared_ptr<tchecker::parsing::inner_declaration_t>,_std::allocator<std::shared_ptr<tchecker::parsing::inner_declaration_t>_>_>_>,___gnu_cxx::__normal_iterator<const_std::shared_ptr<tchecker::parsing::inner_declaration_t>_*,_std::vector<std::shared_ptr<tchecker::parsing::inner_declaration_t>,_std::allocator<std::shared_ptr<tchecker::parsing::inner_declaration_t>_>_>_>_>
  rVar3;
  
  rVar3 = parsing::system_declaration_t::declarations(d);
  for (_Var2 = rVar3._begin._M_current; _Var2._M_current != rVar3._end._M_current._M_current;
      _Var2._M_current = _Var2._M_current + 1) {
    peVar1 = ((_Var2._M_current)->
             super___shared_ptr<tchecker::parsing::inner_declaration_t,_(__gnu_cxx::_Lock_policy)2>)
             ._M_ptr;
    this_00 = ((_Var2._M_current)->
              super___shared_ptr<tchecker::parsing::inner_declaration_t,_(__gnu_cxx::_Lock_policy)2>
              )._M_refcount._M_pi;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
    }
    (*(peVar1->super_declaration_t)._vptr_declaration_t[2])(peVar1,this);
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
  }
  return;
}

Assistant:

virtual void visit(tchecker::parsing::system_declaration_t const & d)
  {
    for (std::shared_ptr<tchecker::parsing::declaration_t> const decl : d.declarations())
      decl->visit(*this);
  }